

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void __thiscall duckdb::QuantileBindData::QuantileBindData(QuantileBindData *this,Value *quantile_p)

{
  byte bVar1;
  FunctionData *pFVar2;
  Value *in_RSI;
  FunctionData *in_RDI;
  allocator_type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  size_type in_stack_fffffffffffffef8;
  vector<duckdb::QuantileValue,_true> *in_stack_ffffffffffffff00;
  vector<unsigned_long,_true> *this_00;
  long local_e0;
  vector<unsigned_long,_true> local_d1;
  Value *in_stack_ffffffffffffff48;
  QuantileValue *in_stack_ffffffffffffff50;
  Value *in_stack_ffffffffffffffb8;
  
  FunctionData::FunctionData(in_RDI);
  *(undefined ***)in_RDI = &PTR__QuantileBindData_010a73a0;
  QuantileAbs<duckdb::Value>(in_stack_ffffffffffffffb8);
  QuantileValue::QuantileValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<duckdb::QuantileValue>::allocator((allocator<duckdb::QuantileValue> *)0x9afd2c);
  vector<duckdb::QuantileValue,_true>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (value_type *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (allocator_type *)in_stack_fffffffffffffee8);
  std::allocator<duckdb::QuantileValue>::~allocator((allocator<duckdb::QuantileValue> *)0x9afd54);
  QuantileValue::~QuantileValue((QuantileValue *)0x9afd61);
  duckdb::Value::~Value((Value *)&stack0xffffffffffffff48);
  pFVar2 = in_RDI + 0x20;
  local_d1.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _1_8_ = 0;
  this_00 = &local_d1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x9afd91);
  vector<unsigned_long,_true>::vector
            (this_00,(size_type)pFVar2,
             (value_type_conflict *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x9afdb6);
  pFVar2 = in_RDI + 0x38;
  local_e0 = 0;
  bVar1 = duckdb::Value::operator<(in_RSI,&local_e0);
  *pFVar2 = (FunctionData)(bVar1 & 1);
  return;
}

Assistant:

QuantileBindData::QuantileBindData(const Value &quantile_p)
    : quantiles(1, QuantileValue(QuantileAbs(quantile_p))), order(1, 0), desc(quantile_p < 0) {
}